

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qcborstreamreader.cpp
# Opt level: O2

StringResult<long_long> __thiscall
QCborStreamReader::readStringChunk(QCborStreamReader *this,char *ptr,qsizetype maxlen)

{
  ReadStringChunk params;
  StringResult<long_long> SVar1;
  StringResult<long_long> SVar2;
  
  params.maxlen_or_type = maxlen;
  params.field_0.ptr = ptr;
  SVar1 = QCborStreamReaderPrivate::readStringChunk(*(QCborStreamReaderPrivate **)(this + 8),params)
  ;
  if ((SVar1.status == EndOfString) && (*(int *)(*(long *)(this + 8) + 0x60) == 0)) {
    preparse(this);
  }
  SVar2._12_4_ = 0;
  SVar2.data = SUB128(SVar1._0_12_,0);
  SVar2.status = SUB124(SVar1._0_12_,8);
  return SVar2;
}

Assistant:

QCborStreamReader::StringResult<qsizetype>
QCborStreamReader::readStringChunk(char *ptr, qsizetype maxlen)
{
    auto r = d->readStringChunk({ptr, maxlen});
    if (r.status == EndOfString && lastError() == QCborError::NoError)
        preparse();
    return r;
}